

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O0

Vector * CGIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
               double OmegaPrecond)

{
  Boolean BVar1;
  LASErrIdType LVar2;
  size_t Dim_00;
  Vector *pVVar3;
  double bNorm_00;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 local_130 [8];
  Vector z;
  Vector q;
  Vector p;
  Vector r;
  size_t Dim;
  double bNorm;
  double RhoOld;
  double Rho;
  double Beta;
  double Alpha;
  int Iter;
  double OmegaPrecond_local;
  PrecondProcType PrecondProc_local;
  int MaxIter_local;
  Vector *b_local;
  Vector *x_local;
  QMatrix *A_local;
  
  bNorm = 0.0;
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim_00 = Q_GetDim(A);
  V_Constr((Vector *)&p.Cmp,"r",Dim_00,Normal,True);
  V_Constr((Vector *)&q.Cmp,"p",Dim_00,Normal,True);
  V_Constr((Vector *)&z.Cmp,"q",Dim_00,Normal,True);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar1 = Q_KerDefined(A), BVar1 != False)) {
    V_Constr((Vector *)local_130,"z",Dim_00,Normal,True);
  }
  LVar2 = LASResult();
  if (LVar2 == LASOK) {
    bNorm_00 = l2Norm_V(b);
    Alpha._4_4_ = 0;
    dVar4 = l1Norm_V(x);
    auVar6._8_4_ = (int)(Dim_00 >> 0x20);
    auVar6._0_8_ = Dim_00;
    auVar6._12_4_ = 0x45300000;
    if (ABS(dVar4 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)Dim_00) - 4503599627370496.0))) <
        2.2250738585072014e-307) {
      Asgn_VV((Vector *)&p.Cmp,b);
    }
    else {
      BVar1 = Q_KerDefined(A);
      if (BVar1 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar3 = Mul_QV(A,x);
      pVVar3 = Sub_VV(b,pVVar3);
      Asgn_VV((Vector *)&p.Cmp,pVVar3);
    }
    if ((PrecondProc == (PrecondProcType)0x0) && (BVar1 = Q_KerDefined(A), BVar1 == False)) {
      while( true ) {
        dVar4 = l2Norm_V((Vector *)&p.Cmp);
        BVar1 = RTCResult(Alpha._4_4_,dVar4,bNorm_00,CGIterId);
        if (BVar1 != False || MaxIter <= Alpha._4_4_) break;
        Alpha._4_4_ = Alpha._4_4_ + 1;
        dVar4 = l2Norm_V((Vector *)&p.Cmp);
        dVar4 = pow(dVar4,2.0);
        if (Alpha._4_4_ == 1) {
          Asgn_VV((Vector *)&q.Cmp,(Vector *)&p.Cmp);
        }
        else {
          pVVar3 = Mul_SV(dVar4 / bNorm,(Vector *)&q.Cmp);
          pVVar3 = Add_VV((Vector *)&p.Cmp,pVVar3);
          Asgn_VV((Vector *)&q.Cmp,pVVar3);
        }
        pVVar3 = Mul_QV(A,(Vector *)&q.Cmp);
        Asgn_VV((Vector *)&z.Cmp,pVVar3);
        dVar5 = Mul_VV((Vector *)&q.Cmp,(Vector *)&z.Cmp);
        pVVar3 = Mul_SV(dVar4 / dVar5,(Vector *)&q.Cmp);
        AddAsgn_VV(x,pVVar3);
        pVVar3 = Mul_SV(dVar4 / dVar5,(Vector *)&z.Cmp);
        SubAsgn_VV((Vector *)&p.Cmp,pVVar3);
        bNorm = dVar4;
      }
    }
    else {
      while( true ) {
        dVar4 = l2Norm_V((Vector *)&p.Cmp);
        BVar1 = RTCResult(Alpha._4_4_,dVar4,bNorm_00,CGIterId);
        if (BVar1 != False || MaxIter <= Alpha._4_4_) break;
        Alpha._4_4_ = Alpha._4_4_ + 1;
        if (PrecondProc == (PrecondProcType)0x0) {
          Asgn_VV((Vector *)local_130,(Vector *)&p.Cmp);
        }
        else {
          (*PrecondProc)(A,(Vector *)local_130,(Vector *)&p.Cmp,OmegaPrecond);
        }
        BVar1 = Q_KerDefined(A);
        if (BVar1 != False) {
          OrthoRightKer_VQ((Vector *)local_130,A);
        }
        dVar4 = Mul_VV((Vector *)&p.Cmp,(Vector *)local_130);
        if (Alpha._4_4_ == 1) {
          Asgn_VV((Vector *)&q.Cmp,(Vector *)local_130);
        }
        else {
          pVVar3 = Mul_SV(dVar4 / bNorm,(Vector *)&q.Cmp);
          pVVar3 = Add_VV((Vector *)local_130,pVVar3);
          Asgn_VV((Vector *)&q.Cmp,pVVar3);
        }
        pVVar3 = Mul_QV(A,(Vector *)&q.Cmp);
        Asgn_VV((Vector *)&z.Cmp,pVVar3);
        dVar5 = Mul_VV((Vector *)&q.Cmp,(Vector *)&z.Cmp);
        pVVar3 = Mul_SV(dVar4 / dVar5,(Vector *)&q.Cmp);
        AddAsgn_VV(x,pVVar3);
        pVVar3 = Mul_SV(dVar4 / dVar5,(Vector *)&z.Cmp);
        SubAsgn_VV((Vector *)&p.Cmp,pVVar3);
        bNorm = dVar4;
      }
    }
    BVar1 = Q_KerDefined(A);
    if (BVar1 != False) {
      OrthoRightKer_VQ(x,A);
    }
  }
  V_Destr((Vector *)&p.Cmp);
  V_Destr((Vector *)&q.Cmp);
  V_Destr((Vector *)&z.Cmp);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar1 = Q_KerDefined(A), BVar1 != False)) {
    V_Destr((Vector *)local_130);
  }
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *CGIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    /*
     *  for details to the algorithm see
     *
     *  R. Barrett, M. Berry, T. F. Chan, J. Demmel, J. Donato, J. Dongarra,
     *  V. Eijkhout, R. Pozo, Ch. Romine, H. van der Vorst:
     *  Templates for the Solution of Linear Systems: Building Blocks
     *  for Iterative Solvers;
     *  SIAM, Philadelphia, 1994
     *
     */

    int Iter;
    double Alpha, Beta, Rho, RhoOld = 0.0;
    double bNorm;
    size_t Dim;
    Vector r, p, q, z;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);
    V_Constr(&p, "p", Dim, Normal, True);
    V_Constr(&q, "q", Dim, Normal, True);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Constr(&z, "z", Dim, Normal, True);

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);
        
        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        if (PrecondProc != NULL || Q_KerDefined(A)) {
            /* preconditioned CG */
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, CGIterId)
                && Iter < MaxIter) {
                Iter++;
		if (PrecondProc != NULL)
                    (*PrecondProc)(A, &z, &r, OmegaPrecond);
		else
		    Asgn_VV(&z, &r);
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&z, A);
                Rho = Mul_VV(&r, &z);
                if (Iter == 1) {
                    Asgn_VV(&p, &z);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&p, Add_VV(&z, Mul_SV(Beta, &p)));
                }
                Asgn_VV(&q, Mul_QV(A, &p));
                Alpha = Rho / Mul_VV(&p, &q);
                AddAsgn_VV(x, Mul_SV(Alpha, &p));
                SubAsgn_VV(&r, Mul_SV(Alpha, &q));
                RhoOld = Rho;
            }
        } else {
            /* plain CG (z = r) */
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, CGIterId)
                && Iter < MaxIter) {
                Iter++;
                Rho = pow(l2Norm_V(&r), 2.0);
                if (Iter == 1) {
                    Asgn_VV(&p, &r);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&p, Add_VV(&r, Mul_SV(Beta, &p)));
                }
                Asgn_VV(&q, Mul_QV(A, &p));
                Alpha = Rho / Mul_VV(&p, &q);
                AddAsgn_VV(x, Mul_SV(Alpha, &p));
                SubAsgn_VV(&r, Mul_SV(Alpha, &q));
                RhoOld = Rho;
            }
        }
        if (Q_KerDefined(A))
	   OrthoRightKer_VQ(x, A);
    }
    
    V_Destr(&r);
    V_Destr(&p);
    V_Destr(&q);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Destr(&z);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}